

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

char * doctest::skipPathFromFilename(char *file)

{
  ContextOptions *pCVar1;
  char *pcVar2;
  char *local_28;
  char *forward;
  char *back;
  char *file_local;
  
  pCVar1 = getContextOptions();
  file_local = file;
  if ((pCVar1->no_path_in_filenames & 1U) != 0) {
    pcVar2 = strrchr(file,0x5c);
    local_28 = strrchr(file,0x2f);
    if ((pcVar2 != (char *)0x0) || (local_28 != (char *)0x0)) {
      if (local_28 < pcVar2) {
        local_28 = pcVar2;
      }
      file_local = local_28 + 1;
    }
  }
  return file_local;
}

Assistant:

const char* skipPathFromFilename(const char* file) {
#ifndef DOCTEST_CONFIG_DISABLE
    if(getContextOptions()->no_path_in_filenames) {
        auto back    = std::strrchr(file, '\\');
        auto forward = std::strrchr(file, '/');
        if(back || forward) {
            if(back > forward)
                forward = back;
            return forward + 1;
        }
    }
#endif // DOCTEST_CONFIG_DISABLE
    return file;
}